

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

void ImageFlipHorizontal(Image *image)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  uint uVar4;
  void *pvVar5;
  int iVar6;
  long lVar7;
  void *pvVar8;
  int iVar9;
  void *pvVar10;
  ulong uVar11;
  long lVar12;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (10 < image->format) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    uVar4 = GetPixelDataSize(1,1,image->format);
    iVar1 = image->width;
    iVar2 = image->height;
    pvVar5 = malloc((long)(int)(iVar2 * iVar1 * uVar4));
    if (0 < (long)iVar2) {
      iVar6 = (iVar1 + -1) * uVar4;
      lVar7 = 0;
      pvVar8 = pvVar5;
      do {
        if (0 < iVar1) {
          lVar12 = 0;
          pvVar10 = pvVar8;
          iVar9 = iVar6;
          do {
            if (0 < (int)uVar4) {
              pvVar3 = image->data;
              uVar11 = 0;
              do {
                *(undefined1 *)((long)pvVar10 + uVar11) =
                     *(undefined1 *)((long)pvVar3 + uVar11 + (long)iVar9);
                uVar11 = uVar11 + 1;
              } while (uVar4 != uVar11);
            }
            lVar12 = lVar12 + 1;
            pvVar10 = (void *)((long)pvVar10 + (long)(int)uVar4);
            iVar9 = iVar9 - uVar4;
          } while (lVar12 != iVar1);
        }
        lVar7 = lVar7 + 1;
        pvVar8 = (void *)((long)pvVar8 + (long)(int)uVar4 * (long)iVar1);
        iVar6 = iVar6 + uVar4 * iVar1;
      } while (lVar7 != iVar2);
    }
    free(image->data);
    image->data = pvVar5;
  }
  return;
}

Assistant:

void ImageFlipHorizontal(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *flippedData = (unsigned char *)RL_MALLOC(image->width*image->height*bytesPerPixel);

        for (int y = 0; y < image->height; y++)
        {
            for (int x = 0; x < image->width; x++)
            {
                // OPTION 1: Move pixels with memcopy()
                //memcpy(flippedData + (y*image->width + x)*bytesPerPixel, ((unsigned char *)image->data) + (y*image->width + (image->width - 1 - x))*bytesPerPixel, bytesPerPixel);

                // OPTION 2: Just copy data pixel by pixel
                for (int i = 0; i < bytesPerPixel; i++) flippedData[(y*image->width + x)*bytesPerPixel + i] = ((unsigned char *)image->data)[(y*image->width + (image->width - 1 - x))*bytesPerPixel + i];
            }
        }

        RL_FREE(image->data);
        image->data = flippedData;

        /*
        // OPTION 3: Faster implementation (specific for 32bit pixels)
        // NOTE: It does not require additional allocations
        uint32_t *ptr = (uint32_t *)image->data;
        for (int y = 0; y < image->height; y++)
        {
            for (int x = 0; x < image->width/2; x++)
            {
                uint32_t backup = ptr[y*image->width + x];
                ptr[y*image->width + x] = ptr[y*image->width + (image->width - 1 - x)];
                ptr[y*image->width + (image->width - 1 - x)] = backup;
            }
        }
        */
    }
}